

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O1

P_Sequence * compile_top(Pattern *p)

{
  pointer *pppPVar1;
  iterator __position;
  P_Sequence *pPVar2;
  Pattern *local_10;
  
  AST::dispatch<compile_template>(p);
  pPVar2 = sequencify((Pattern *)0x10a986);
  local_10 = (Pattern *)operator_new(4);
  *(undefined4 *)local_10 = 9;
  __position._M_current =
       (pPVar2->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar2->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              ((vector<Pattern*,std::allocator<Pattern*>> *)&pPVar2->v,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppPVar1 = &(pPVar2->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return pPVar2;
}

Assistant:

static Pattern* compile(AST::Pattern* p) {
    return AST::dispatch<compile_template>(p);
}